

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void setMethyleneProp(atom *a)

{
  char *pcVar1;
  bool bVar2;
  ResidueAndAtomPair *local_18;
  ResidueAndAtomPair *pair;
  atom *a_local;
  
  pcVar1 = strstr(MethyleneResList,a->r->resname);
  if (pcVar1 != (char *)0x0) {
    local_18 = MethyleneAtomsTbl;
    while( true ) {
      bVar2 = false;
      if (local_18->rlist != (char *)0x0) {
        bVar2 = local_18->alist != (char *)0x0;
      }
      if (!bVar2) {
        return;
      }
      pcVar1 = strstr(local_18->rlist,a->r->resname);
      if ((pcVar1 != (char *)0x0) &&
         (pcVar1 = strstr(local_18->alist,a->atomname), pcVar1 != (char *)0x0)) break;
      local_18 = local_18 + 1;
    }
    a->props = a->props | 0x40000000;
  }
  return;
}

Assistant:

void setMethyleneProp(atom *a) {
   ResidueAndAtomPair *pair;

   if(strstr(MethyleneResList, a->r->resname)) {
      for(pair = MethyleneAtomsTbl; pair->rlist && pair->alist; pair++) {
         if(   (strstr(pair->rlist, a->r->resname))
            && (strstr(pair->alist, a->atomname))   ) {
            a->props |= METHYLENE_PROP;
            break;
         }
      }
   }
}